

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# facenet.cpp
# Opt level: O0

void __thiscall facenet::Reduction_B(facenet *this,pBox *input,pBox *output)

{
  pBox *this_00;
  pBox *this_01;
  pBox *this_02;
  pBox *this_03;
  pBox *this_04;
  pBox *this_05;
  pBox *this_06;
  Weight *weight;
  Weight *weight_00;
  Weight *weight_01;
  Weight *weight_02;
  Weight *weight_03;
  Weight *weight_04;
  Weight *weight_05;
  pBox *this_07;
  BN *var;
  BN *mean;
  BN *beta;
  BN *var_00;
  BN *mean_00;
  BN *beta_00;
  BN *var_01;
  BN *mean_01;
  BN *beta_01;
  BN *var_02;
  BN *mean_02;
  BN *beta_02;
  BN *var_03;
  BN *mean_03;
  BN *beta_03;
  BN *var_04;
  BN *mean_04;
  BN *beta_04;
  BN *var_05;
  BN *mean_05;
  BN *beta_05;
  mydataFmt *pmVar1;
  string local_3c8;
  string local_398;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_378;
  undefined1 local_358 [8];
  string filename;
  mydataFmt *pointTeam [28];
  long dataNumber [28];
  long conv7;
  long conv6;
  long conv5;
  long conv4;
  long conv3;
  long conv2;
  long conv1;
  BN *conv7_beta;
  BN *conv7_mean;
  BN *conv7_var;
  BN *conv6_beta;
  BN *conv6_mean;
  BN *conv6_var;
  BN *conv5_beta;
  BN *conv5_mean;
  BN *conv5_var;
  BN *conv4_beta;
  BN *conv4_mean;
  BN *conv4_var;
  BN *conv3_beta;
  BN *conv3_mean;
  BN *conv3_var;
  BN *conv2_beta;
  BN *conv2_mean;
  BN *conv2_var;
  BN *conv1_beta;
  BN *conv1_mean;
  BN *conv1_var;
  pBox *pooling1_out;
  Weight *conv7_wb;
  Weight *conv6_wb;
  Weight *conv5_wb;
  Weight *conv4_wb;
  Weight *conv3_wb;
  Weight *conv2_wb;
  Weight *conv1_wb;
  pBox *conv7_out;
  pBox *conv6_out;
  pBox *conv5_out;
  pBox *conv4_out;
  pBox *conv3_out;
  pBox *conv2_out;
  pBox *conv1_out;
  pBox *output_local;
  pBox *input_local;
  facenet *this_local;
  
  this_00 = (pBox *)operator_new(0x38);
  pBox::pBox(this_00);
  this_01 = (pBox *)operator_new(0x38);
  pBox::pBox(this_01);
  this_02 = (pBox *)operator_new(0x38);
  pBox::pBox(this_02);
  this_03 = (pBox *)operator_new(0x38);
  pBox::pBox(this_03);
  this_04 = (pBox *)operator_new(0x38);
  pBox::pBox(this_04);
  this_05 = (pBox *)operator_new(0x38);
  pBox::pBox(this_05);
  this_06 = (pBox *)operator_new(0x38);
  pBox::pBox(this_06);
  weight = (Weight *)operator_new(0x38);
  weight_00 = (Weight *)operator_new(0x38);
  weight_01 = (Weight *)operator_new(0x38);
  weight_02 = (Weight *)operator_new(0x38);
  weight_03 = (Weight *)operator_new(0x38);
  weight_04 = (Weight *)operator_new(0x38);
  weight_05 = (Weight *)operator_new(0x38);
  this_07 = (pBox *)operator_new(0x38);
  pBox::pBox(this_07);
  var = (BN *)operator_new(0x10);
  mean = (BN *)operator_new(0x10);
  beta = (BN *)operator_new(0x10);
  var_00 = (BN *)operator_new(0x10);
  mean_00 = (BN *)operator_new(0x10);
  beta_00 = (BN *)operator_new(0x10);
  var_01 = (BN *)operator_new(0x10);
  mean_01 = (BN *)operator_new(0x10);
  beta_01 = (BN *)operator_new(0x10);
  var_02 = (BN *)operator_new(0x10);
  mean_02 = (BN *)operator_new(0x10);
  beta_02 = (BN *)operator_new(0x10);
  var_03 = (BN *)operator_new(0x10);
  mean_03 = (BN *)operator_new(0x10);
  beta_03 = (BN *)operator_new(0x10);
  var_04 = (BN *)operator_new(0x10);
  mean_04 = (BN *)operator_new(0x10);
  beta_04 = (BN *)operator_new(0x10);
  var_05 = (BN *)operator_new(0x10);
  mean_05 = (BN *)operator_new(0x10);
  beta_05 = (BN *)operator_new(0x10);
  pmVar1 = (mydataFmt *)ConvAndFcInit(weight,0x100,0x380,1,1,0,0,0,0,0);
  BatchNormInit(beta,mean,var,0x100);
  ConvAndFcInit(weight_00,0x180,0x100,3,2,0,0,0,0,0);
  BatchNormInit(beta_00,mean_00,var_00,0x180);
  ConvAndFcInit(weight_01,0x100,0x380,1,1,0,0,0,0,0);
  BatchNormInit(beta_01,mean_01,var_01,0x100);
  ConvAndFcInit(weight_02,0x100,0x100,3,2,0,0,0,0,0);
  BatchNormInit(beta_02,mean_02,var_02,0x100);
  ConvAndFcInit(weight_03,0x100,0x380,1,1,0,0,0,0,0);
  BatchNormInit(beta_03,mean_03,var_03,0x100);
  ConvAndFcInit(weight_04,0x100,0x100,3,1,1,0,0,0,0);
  BatchNormInit(beta_04,mean_04,var_04,0x100);
  ConvAndFcInit(weight_05,0x100,0x100,3,2,0,0,0,0,0);
  BatchNormInit(beta_05,mean_05,var_05,0x100);
  filename.field_2._8_8_ = weight->pdata;
  pointTeam[0] = beta->pdata;
  pointTeam[1] = mean->pdata;
  pointTeam[2] = var->pdata;
  pointTeam[3] = weight_00->pdata;
  pointTeam[4] = beta_00->pdata;
  pointTeam[5] = mean_00->pdata;
  pointTeam[6] = var_00->pdata;
  pointTeam[7] = weight_01->pdata;
  pointTeam[8] = beta_01->pdata;
  pointTeam[9] = mean_01->pdata;
  pointTeam[10] = var_01->pdata;
  pointTeam[0xb] = weight_02->pdata;
  pointTeam[0xc] = beta_02->pdata;
  pointTeam[0xd] = mean_02->pdata;
  pointTeam[0xe] = var_02->pdata;
  pointTeam[0xf] = weight_03->pdata;
  pointTeam[0x10] = beta_03->pdata;
  pointTeam[0x11] = mean_03->pdata;
  pointTeam[0x12] = var_03->pdata;
  pointTeam[0x13] = weight_04->pdata;
  pointTeam[0x14] = beta_04->pdata;
  pointTeam[0x15] = mean_04->pdata;
  pointTeam[0x16] = var_04->pdata;
  pointTeam[0x17] = weight_05->pdata;
  pointTeam[0x18] = beta_05->pdata;
  pointTeam[0x19] = mean_05->pdata;
  pointTeam[0x1a] = var_05->pdata;
  pointTeam[0x1b] = pmVar1;
  std::__cxx11::to_string(&local_398,0x80);
  std::operator+(&local_378,"../model_",&local_398);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_358,
                 &local_378,"/Mixed_7a_list.txt");
  std::__cxx11::string::~string((string *)&local_378);
  std::__cxx11::string::~string((string *)&local_398);
  std::__cxx11::string::string((string *)&local_3c8,(string *)local_358);
  readData(&local_3c8,(long *)(pointTeam + 0x1b),(mydataFmt **)((long)&filename.field_2 + 8),0x1c);
  std::__cxx11::string::~string((string *)&local_3c8);
  maxPoolingInit(input,this_07,3,2,1);
  maxPooling(input,this_07,3,2);
  convolutionInit(weight,input,this_00);
  convolution(weight,input,this_00);
  BatchNorm(this_00,beta,mean,var);
  relu(this_00,weight->pbias);
  convolutionInit(weight_00,this_00,this_01);
  convolution(weight_00,this_00,this_01);
  BatchNorm(this_01,beta_00,mean_00,var_00);
  relu(this_01,weight_00->pbias);
  convolutionInit(weight_01,input,this_02);
  convolution(weight_01,input,this_02);
  BatchNorm(this_02,beta_01,mean_01,var_01);
  relu(this_02,weight_01->pbias);
  convolutionInit(weight_02,this_02,this_03);
  convolution(weight_02,this_02,this_03);
  BatchNorm(this_03,beta_02,mean_02,var_02);
  relu(this_03,weight_02->pbias);
  convolutionInit(weight_03,input,this_04);
  convolution(weight_03,input,this_04);
  BatchNorm(this_04,beta_03,mean_03,var_03);
  relu(this_04,weight_03->pbias);
  convolutionInit(weight_04,this_04,this_05);
  convolution(weight_04,this_04,this_05);
  BatchNorm(this_05,beta_04,mean_04,var_04);
  relu(this_05,weight_04->pbias);
  convolutionInit(weight_05,this_05,this_06);
  convolution(weight_05,this_05,this_06);
  BatchNorm(this_06,beta_05,mean_05,var_05);
  relu(this_06,weight_05->pbias);
  conv_mergeInit(output,this_01,this_03,this_06,this_07);
  conv_merge(output,this_01,this_03,this_06,this_07);
  freepBox(this_00);
  freepBox(this_01);
  freepBox(this_02);
  freepBox(this_03);
  freepBox(this_04);
  freepBox(this_05);
  freepBox(this_06);
  freeWeight(weight);
  freeWeight(weight_00);
  freeWeight(weight_01);
  freeWeight(weight_02);
  freeWeight(weight_03);
  freeWeight(weight_04);
  freeWeight(weight_05);
  freepBox(this_07);
  freeBN(var);
  freeBN(mean);
  freeBN(beta);
  freeBN(var_00);
  freeBN(mean_00);
  freeBN(beta_00);
  freeBN(var_01);
  freeBN(mean_01);
  freeBN(beta_01);
  freeBN(var_02);
  freeBN(mean_02);
  freeBN(beta_02);
  freeBN(var_03);
  freeBN(mean_03);
  freeBN(beta_03);
  freeBN(var_04);
  freeBN(mean_04);
  freeBN(beta_04);
  freeBN(var_05);
  freeBN(mean_05);
  freeBN(beta_05);
  std::__cxx11::string::~string((string *)local_358);
  return;
}

Assistant:

void facenet::Reduction_B(pBox *input, pBox *output) {
    pBox *conv1_out = new pBox;
    pBox *conv2_out = new pBox;
    pBox *conv3_out = new pBox;
    pBox *conv4_out = new pBox;
    pBox *conv5_out = new pBox;
    pBox *conv6_out = new pBox;
    pBox *conv7_out = new pBox;

    struct Weight *conv1_wb = new Weight;
    struct Weight *conv2_wb = new Weight;
    struct Weight *conv3_wb = new Weight;
    struct Weight *conv4_wb = new Weight;
    struct Weight *conv5_wb = new Weight;
    struct Weight *conv6_wb = new Weight;
    struct Weight *conv7_wb = new Weight;

    struct pBox *pooling1_out = new pBox;

    struct BN *conv1_var = new BN;
    struct BN *conv1_mean = new BN;
    struct BN *conv1_beta = new BN;
    struct BN *conv2_var = new BN;
    struct BN *conv2_mean = new BN;
    struct BN *conv2_beta = new BN;
    struct BN *conv3_var = new BN;
    struct BN *conv3_mean = new BN;
    struct BN *conv3_beta = new BN;
    struct BN *conv4_var = new BN;
    struct BN *conv4_mean = new BN;
    struct BN *conv4_beta = new BN;
    struct BN *conv5_var = new BN;
    struct BN *conv5_mean = new BN;
    struct BN *conv5_beta = new BN;
    struct BN *conv6_var = new BN;
    struct BN *conv6_mean = new BN;
    struct BN *conv6_beta = new BN;
    struct BN *conv7_var = new BN;
    struct BN *conv7_mean = new BN;
    struct BN *conv7_beta = new BN;


    long conv1 = ConvAndFcInit(conv1_wb, 256, 896, 1, 1, 0);
    BatchNormInit(conv1_beta, conv1_mean, conv1_var, 256);
    long conv2 = ConvAndFcInit(conv2_wb, 384, 256, 3, 2, 0);
    BatchNormInit(conv2_beta, conv2_mean, conv2_var, 384);

    long conv3 = ConvAndFcInit(conv3_wb, 256, 896, 1, 1, 0);
    BatchNormInit(conv3_beta, conv3_mean, conv3_var, 256);
    long conv4 = ConvAndFcInit(conv4_wb, 256, 256, 3, 2, 0);
    BatchNormInit(conv4_beta, conv4_mean, conv4_var, 256);

    long conv5 = ConvAndFcInit(conv5_wb, 256, 896, 1, 1, 0);
    BatchNormInit(conv5_beta, conv5_mean, conv5_var, 256);
    long conv6 = ConvAndFcInit(conv6_wb, 256, 256, 3, 1, 1);
    BatchNormInit(conv6_beta, conv6_mean, conv6_var, 256);
    long conv7 = ConvAndFcInit(conv7_wb, 256, 256, 3, 2, 0);
    BatchNormInit(conv7_beta, conv7_mean, conv7_var, 256);

    long dataNumber[28] = {conv1, 256, 256, 256, conv2, 384, 384, 384, conv3, 256, 256, 256, conv4, 256, 256, 256,
                           conv5, 256, 256, 256, conv6, 256, 256, 256, conv7, 256, 256, 256};

//    mydataFmt *pointTeam[28] = {
//                            conv1_wb->pdata, conv1_var->pdata, conv1_mean->pdata, conv1_beta->pdata, \
//                            conv2_wb->pdata, conv2_var->pdata, conv2_mean->pdata, conv2_beta->pdata, \
//                            conv3_wb->pdata, conv3_var->pdata, conv3_mean->pdata, conv3_beta->pdata, \
//                            conv4_wb->pdata, conv4_var->pdata, conv4_mean->pdata, conv4_beta->pdata, \
//                            conv5_wb->pdata, conv5_var->pdata, conv5_mean->pdata, conv5_beta->pdata, \
//                            conv6_wb->pdata, conv6_var->pdata, conv6_mean->pdata, conv6_beta->pdata, \
//                            conv7_wb->pdata, conv7_var->pdata, conv7_mean->pdata, conv7_beta->pdata};
    mydataFmt *pointTeam[28] = {
                            conv1_wb->pdata, conv1_beta->pdata, conv1_mean->pdata, conv1_var->pdata, \
                            conv2_wb->pdata, conv2_beta->pdata, conv2_mean->pdata, conv2_var->pdata, \
                            conv3_wb->pdata, conv3_beta->pdata, conv3_mean->pdata, conv3_var->pdata, \
                            conv4_wb->pdata, conv4_beta->pdata, conv4_mean->pdata, conv4_var->pdata, \
                            conv5_wb->pdata, conv5_beta->pdata, conv5_mean->pdata, conv5_var->pdata, \
                            conv6_wb->pdata, conv6_beta->pdata, conv6_mean->pdata, conv6_var->pdata, \
                            conv7_wb->pdata, conv7_beta->pdata, conv7_mean->pdata, conv7_var->pdata};
    string filename = "../model_" + to_string(Num) + "/Mixed_7a_list.txt";
    readData(filename, dataNumber, pointTeam, 28);


    maxPoolingInit(input, pooling1_out, 3, 2, 1);
    // 8*8*896
    maxPooling(input, pooling1_out, 3, 2);

    convolutionInit(conv1_wb, input, conv1_out);
    //conv1 17 x 17 x 256
    convolution(conv1_wb, input, conv1_out);
    BatchNorm(conv1_out, conv1_beta, conv1_mean, conv1_var);
//    BatchNorm(conv1_out, conv1_var, conv1_mean, conv1_beta);
    relu(conv1_out, conv1_wb->pbias);

    convolutionInit(conv2_wb, conv1_out, conv2_out);
    //conv2 8 x 8 x 384
    convolution(conv2_wb, conv1_out, conv2_out);
    BatchNorm(conv2_out, conv2_beta, conv2_mean, conv2_var);
//    BatchNorm(conv2_out, conv2_var, conv2_mean, conv2_beta);
    relu(conv2_out, conv2_wb->pbias);

    convolutionInit(conv3_wb, input, conv3_out);
    //conv3 17 x 17 x 256
    convolution(conv3_wb, input, conv3_out);
    BatchNorm(conv3_out, conv3_beta, conv3_mean, conv3_var);
//    BatchNorm(conv3_out, conv3_var, conv3_mean, conv3_beta);
    relu(conv3_out, conv3_wb->pbias);

    convolutionInit(conv4_wb, conv3_out, conv4_out);
    //conv4 8 x 8 x 256
    convolution(conv4_wb, conv3_out, conv4_out);
    BatchNorm(conv4_out, conv4_beta, conv4_mean, conv4_var);
    relu(conv4_out, conv4_wb->pbias);

    convolutionInit(conv5_wb, input, conv5_out);
    //conv5 17 x 17 x 256
    convolution(conv5_wb, input, conv5_out);
    BatchNorm(conv5_out, conv5_beta, conv5_mean, conv5_var);
    relu(conv5_out, conv5_wb->pbias);

    convolutionInit(conv6_wb, conv5_out, conv6_out);
    //conv6 17 x 17 x 256
    convolution(conv6_wb, conv5_out, conv6_out);
    BatchNorm(conv6_out, conv6_beta, conv6_mean, conv6_var);
    relu(conv6_out, conv6_wb->pbias);

    convolutionInit(conv7_wb, conv6_out, conv7_out);
    //conv6 8 x 8 x 256
    convolution(conv7_wb, conv6_out, conv7_out);
    BatchNorm(conv7_out, conv7_beta, conv7_mean, conv7_var);
    relu(conv7_out, conv7_wb->pbias);

    conv_mergeInit(output, conv2_out, conv4_out, conv7_out, pooling1_out);
    //8*8*1792
    conv_merge(output, conv2_out, conv4_out, conv7_out, pooling1_out);

    freepBox(conv1_out);
    freepBox(conv2_out);
    freepBox(conv3_out);
    freepBox(conv4_out);
    freepBox(conv5_out);
    freepBox(conv6_out);
    freepBox(conv7_out);

    freeWeight(conv1_wb);
    freeWeight(conv2_wb);
    freeWeight(conv3_wb);
    freeWeight(conv4_wb);
    freeWeight(conv5_wb);
    freeWeight(conv6_wb);
    freeWeight(conv7_wb);

    freepBox(pooling1_out);

    freeBN(conv1_var);
    freeBN(conv1_mean);
    freeBN(conv1_beta);
    freeBN(conv2_var);
    freeBN(conv2_mean);
    freeBN(conv2_beta);
    freeBN(conv3_var);
    freeBN(conv3_mean);
    freeBN(conv3_beta);
    freeBN(conv4_var);
    freeBN(conv4_mean);
    freeBN(conv4_beta);
    freeBN(conv5_var);
    freeBN(conv5_mean);
    freeBN(conv5_beta);
    freeBN(conv6_var);
    freeBN(conv6_mean);
    freeBN(conv6_beta);
    freeBN(conv7_var);
    freeBN(conv7_mean);
    freeBN(conv7_beta);
}